

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::AddTriangleMesh
          (ChConvexDecompositionHACD *this,ChTriangleMesh *tm)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  
  iVar2 = (*(tm->super_ChGeometry)._vptr_ChGeometry[0xd])(tm);
  if (iVar2 < 1) {
    cVar1 = '\x01';
  }
  else {
    uVar4 = 0;
    do {
      (*(tm->super_ChGeometry)._vptr_ChGeometry[0xe])(local_80,tm,uVar4);
      iVar2 = (*(this->super_ChConvexDecomposition)._vptr_ChConvexDecomposition[3])
                        (this,local_78,local_60,local_48);
      cVar1 = (char)iVar2;
      if (cVar1 == '\0') {
        return false;
      }
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
      iVar2 = (*(tm->super_ChGeometry)._vptr_ChGeometry[0xd])(tm);
    } while ((int)uVar3 < iVar2);
  }
  return (bool)cVar1;
}

Assistant:

bool ChConvexDecompositionHACD::AddTriangleMesh(const geometry::ChTriangleMesh& tm) {
    for (int i = 0; i < tm.getNumTriangles(); i++) {
        if (!this->ChConvexDecomposition::AddTriangle(tm.getTriangle(i)))
            return false;
    }
    return true;
}